

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutual_info.c
# Opt level: O2

double * inform_local_mutual_info(int *series,size_t l,size_t n,int *b,double *mi,inform_error *err)

{
  uint64_t uVar1;
  inform_dist *piVar2;
  _Bool _Var3;
  size_t i;
  double *__ptr;
  inform_dist **marginals;
  size_t sVar4;
  long lVar5;
  int *piVar6;
  size_t sVar7;
  double dVar8;
  inform_dist *joint;
  inform_dist *local_40;
  double local_38;
  
  _Var3 = check_arguments(series,l,n,b,err);
  if (!_Var3) {
    __ptr = mi;
    if (((mi == (double *)0x0) && (__ptr = (double *)malloc(n * 8), __ptr == (double *)0x0)) ||
       (marginals = (inform_dist **)malloc(l * 8), marginals == (inform_dist **)0x0)) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
    }
    else {
      local_40 = (inform_dist *)0x0;
      _Var3 = allocate(b,l,&local_40,marginals,err);
      piVar2 = local_40;
      if (!_Var3) {
        accumulate(series,l,n,b,local_40,marginals);
        local_38 = 1.0;
        for (sVar4 = 0; l != sVar4; sVar4 = sVar4 + 1) {
          local_38 = local_38 *
                     (((double)CONCAT44(0x45300000,(int)(marginals[sVar4]->counts >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)marginals[sVar4]->counts) -
                     4503599627370496.0));
        }
        uVar1 = piVar2->counts;
        local_38 = local_38 /
                   (((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
        for (sVar4 = 0; sVar4 != n; sVar4 = sVar4 + 1) {
          dVar8 = 1.0;
          lVar5 = 0;
          piVar6 = series;
          for (sVar7 = 0; l != sVar7; sVar7 = sVar7 + 1) {
            dVar8 = dVar8 * (double)marginals[sVar7]->histogram[*piVar6];
            lVar5 = lVar5 * b[sVar7] + (long)*piVar6;
            piVar6 = piVar6 + n;
          }
          dVar8 = log2(((double)piVar2->histogram[lVar5] * local_38) / dVar8);
          __ptr[sVar4] = dVar8;
          series = series + 1;
        }
        free_all(&local_40,marginals,l);
        return __ptr;
      }
      if (mi == (double *)0x0) {
        free(__ptr);
      }
      free(marginals);
    }
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_mutual_info(int const *series, size_t l, size_t n,
    int const *b, double *mi, inform_error *err)
{
    if (check_arguments(series, l, n, b, err)) return NULL;

    bool allocate_mi = (mi == NULL);
    if (allocate_mi)
    {
        mi = malloc(n * sizeof(double));
        if (mi == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    inform_dist **marginals = malloc(l * sizeof(inform_dist*));
    if (marginals == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    inform_dist *joint = NULL;
    if (allocate(b, l, &joint, marginals, err))
    {
        if (allocate_mi) free(mi);
        free(marginals);
        return NULL;
    }

    accumulate(series, l, n, b, joint, marginals);

    double norm = 1;
    for (size_t i = 0; i < l; ++i) norm *= marginals[i]->counts;
    norm /= joint->counts;

    double j, m;
    for (size_t i = 0; i < n; ++i)
    {
        m = 1;
        size_t joint_event = 0;
        for (size_t j = 0; j < l; ++j)
        {
            int marginal_event = series[i + n * j];
            m *= marginals[j]->histogram[marginal_event];
            joint_event = joint_event * b[j] + marginal_event;
        }
        j = joint->histogram[joint_event];
        mi[i] = log2((j * norm) / m);
    }

    free_all(&joint, marginals, l);

    return mi;
}